

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O3

wchar_t time_excluded(archive_match *a,archive_entry *entry)

{
  byte bVar1;
  uint uVar2;
  wchar_t wVar3;
  uint uVar4;
  long lVar5;
  time_t tVar6;
  char *key;
  archive_rb_node *paVar7;
  
  if (a->newer_ctime_filter != L'\0') {
    wVar3 = archive_entry_ctime_is_set(entry);
    if (wVar3 == L'\0') {
      lVar5 = archive_entry_mtime(entry);
    }
    else {
      lVar5 = archive_entry_ctime(entry);
    }
    if (lVar5 < a->newer_ctime_sec) {
      return L'\x01';
    }
    if (lVar5 == a->newer_ctime_sec) {
      wVar3 = archive_entry_ctime_is_set(entry);
      if (wVar3 == L'\0') {
        lVar5 = archive_entry_mtime_nsec(entry);
      }
      else {
        lVar5 = archive_entry_ctime_nsec(entry);
      }
      if (lVar5 < a->newer_ctime_nsec) {
        return L'\x01';
      }
      if ((lVar5 == a->newer_ctime_nsec) && ((a->newer_ctime_filter & L'\x10') == L'\0')) {
        return L'\x01';
      }
    }
  }
  if (a->older_ctime_filter != L'\0') {
    wVar3 = archive_entry_ctime_is_set(entry);
    if (wVar3 == L'\0') {
      lVar5 = archive_entry_mtime(entry);
    }
    else {
      lVar5 = archive_entry_ctime(entry);
    }
    if (a->older_ctime_sec < lVar5) {
      return L'\x01';
    }
    if (lVar5 == a->older_ctime_sec) {
      wVar3 = archive_entry_ctime_is_set(entry);
      if (wVar3 == L'\0') {
        lVar5 = archive_entry_mtime_nsec(entry);
      }
      else {
        lVar5 = archive_entry_ctime_nsec(entry);
      }
      if (a->older_ctime_nsec < lVar5) {
        return L'\x01';
      }
      if ((lVar5 == a->older_ctime_nsec) && ((a->older_ctime_filter & L'\x10') == L'\0')) {
        return L'\x01';
      }
    }
  }
  if (a->newer_mtime_filter != L'\0') {
    tVar6 = archive_entry_mtime(entry);
    if (tVar6 < a->newer_mtime_sec) {
      return L'\x01';
    }
    if (tVar6 == a->newer_mtime_sec) {
      lVar5 = archive_entry_mtime_nsec(entry);
      if (lVar5 < a->newer_mtime_nsec) {
        return L'\x01';
      }
      if ((lVar5 == a->newer_mtime_nsec) && ((a->newer_mtime_filter & L'\x10') == L'\0')) {
        return L'\x01';
      }
    }
  }
  if (a->older_mtime_filter != L'\0') {
    tVar6 = archive_entry_mtime(entry);
    if (a->older_mtime_sec < tVar6) {
      return L'\x01';
    }
    lVar5 = archive_entry_mtime_nsec(entry);
    if (tVar6 == a->older_mtime_sec) {
      if (a->older_mtime_nsec < lVar5) {
        return L'\x01';
      }
      if ((lVar5 == a->older_mtime_nsec) && ((a->older_mtime_filter & L'\x10') == L'\0')) {
        return L'\x01';
      }
    }
  }
  if ((a->exclusion_entry_list).count == L'\0') {
    return L'\0';
  }
  key = archive_entry_pathname(entry);
  (a->exclusion_tree).rbt_ops = &rb_ops_mbs;
  if (key == (char *)0x0) {
    return L'\0';
  }
  paVar7 = __archive_rb_tree_find_node(&a->exclusion_tree,key);
  if (paVar7 == (archive_rb_node *)0x0) {
    return L'\0';
  }
  uVar4 = (uint)paVar7[5].rb_info;
  if ((uVar4 >> 9 & 1) != 0) {
    tVar6 = archive_entry_ctime(entry);
    if (tVar6 < (long)paVar7[6].rb_info) {
LAB_0043b566:
      uVar4 = (uint)paVar7[5].rb_info;
      uVar2 = uVar4 & 2;
    }
    else if ((long)paVar7[6].rb_info < tVar6) {
      uVar4 = (uint)paVar7[5].rb_info;
LAB_0043b581:
      uVar2 = uVar4 & 1;
    }
    else {
      lVar5 = archive_entry_ctime_nsec(entry);
      if (lVar5 < (long)paVar7[7].rb_nodes[0]) goto LAB_0043b566;
      uVar4 = (uint)paVar7[5].rb_info;
      if ((long)paVar7[7].rb_nodes[0] < lVar5) goto LAB_0043b581;
      uVar2 = uVar4 & 0x10;
    }
    if (uVar2 != 0) {
      return L'\x01';
    }
  }
  if ((uVar4 >> 8 & 1) == 0) {
    return L'\0';
  }
  tVar6 = archive_entry_mtime(entry);
  if ((long)paVar7[6].rb_nodes[0] <= tVar6) {
    if ((long)paVar7[6].rb_nodes[0] < tVar6) {
      bVar1 = (byte)paVar7[5].rb_info & 1;
      goto joined_r0x0043b5c1;
    }
    lVar5 = archive_entry_mtime_nsec(entry);
    if ((long)paVar7[6].rb_nodes[1] <= lVar5) {
      uVar4 = (uint)paVar7[5].rb_info;
      if ((long)paVar7[6].rb_nodes[1] < lVar5) {
        uVar4 = uVar4 & 1;
      }
      else {
        uVar4 = uVar4 & 0x10;
      }
      if (uVar4 == 0) {
        return L'\0';
      }
      return L'\x01';
    }
  }
  bVar1 = (byte)paVar7[5].rb_info & 2;
joined_r0x0043b5c1:
  if (bVar1 == 0) {
    return L'\0';
  }
  return L'\x01';
}

Assistant:

static int
time_excluded(struct archive_match *a, struct archive_entry *entry)
{
	struct match_file *f;
	const void *pathname;
	time_t sec;
	long nsec;

	/*
	 * If this file/dir is excluded by a time comparison, skip it.
	 */
	if (a->newer_ctime_filter) {
		/* If ctime is not set, use mtime instead. */
		if (archive_entry_ctime_is_set(entry))
			sec = archive_entry_ctime(entry);
		else
			sec = archive_entry_mtime(entry);
		if (sec < a->newer_ctime_sec)
			return (1); /* Too old, skip it. */
		if (sec == a->newer_ctime_sec) {
			if (archive_entry_ctime_is_set(entry))
				nsec = archive_entry_ctime_nsec(entry);
			else
				nsec = archive_entry_mtime_nsec(entry);
			if (nsec < a->newer_ctime_nsec)
				return (1); /* Too old, skip it. */
			if (nsec == a->newer_ctime_nsec &&
			    (a->newer_ctime_filter & ARCHIVE_MATCH_EQUAL)
			      == 0)
				return (1); /* Equal, skip it. */
		}
	}
	if (a->older_ctime_filter) {
		/* If ctime is not set, use mtime instead. */
		if (archive_entry_ctime_is_set(entry))
			sec = archive_entry_ctime(entry);
		else
			sec = archive_entry_mtime(entry);
		if (sec > a->older_ctime_sec)
			return (1); /* Too new, skip it. */
		if (sec == a->older_ctime_sec) {
			if (archive_entry_ctime_is_set(entry))
				nsec = archive_entry_ctime_nsec(entry);
			else
				nsec = archive_entry_mtime_nsec(entry);
			if (nsec > a->older_ctime_nsec)
				return (1); /* Too new, skip it. */
			if (nsec == a->older_ctime_nsec &&
			    (a->older_ctime_filter & ARCHIVE_MATCH_EQUAL)
			      == 0)
				return (1); /* Eeual, skip it. */
		}
	}
	if (a->newer_mtime_filter) {
		sec = archive_entry_mtime(entry);
		if (sec < a->newer_mtime_sec)
			return (1); /* Too old, skip it. */
		if (sec == a->newer_mtime_sec) {
			nsec = archive_entry_mtime_nsec(entry);
			if (nsec < a->newer_mtime_nsec)
				return (1); /* Too old, skip it. */
			if (nsec == a->newer_mtime_nsec &&
			    (a->newer_mtime_filter & ARCHIVE_MATCH_EQUAL)
			       == 0)
				return (1); /* Equal, skip it. */
		}
	}
	if (a->older_mtime_filter) {
		sec = archive_entry_mtime(entry);
		if (sec > a->older_mtime_sec)
			return (1); /* Too new, skip it. */
		nsec = archive_entry_mtime_nsec(entry);
		if (sec == a->older_mtime_sec) {
			if (nsec > a->older_mtime_nsec)
				return (1); /* Too new, skip it. */
			if (nsec == a->older_mtime_nsec &&
			    (a->older_mtime_filter & ARCHIVE_MATCH_EQUAL)
			       == 0)
				return (1); /* Equal, skip it. */
		}
	}

	/* If there is no excluson list, include the file. */
	if (a->exclusion_entry_list.count == 0)
		return (0);

#if defined(_WIN32) && !defined(__CYGWIN__)
	pathname = archive_entry_pathname_w(entry);
	a->exclusion_tree.rbt_ops = &rb_ops_wcs;
#else
	(void)rb_ops_wcs;
	pathname = archive_entry_pathname(entry);
	a->exclusion_tree.rbt_ops = &rb_ops_mbs;
#endif
	if (pathname == NULL)
		return (0);

	f = (struct match_file *)__archive_rb_tree_find_node(
		&(a->exclusion_tree), pathname);
	/* If the file wasn't rejected, include it. */
	if (f == NULL)
		return (0);

	if (f->flag & ARCHIVE_MATCH_CTIME) {
		sec = archive_entry_ctime(entry);
		if (f->ctime_sec > sec) {
			if (f->flag & ARCHIVE_MATCH_OLDER)
				return (1);
		} else if (f->ctime_sec < sec) {
			if (f->flag & ARCHIVE_MATCH_NEWER)
				return (1);
		} else {
			nsec = archive_entry_ctime_nsec(entry);
			if (f->ctime_nsec > nsec) {
				if (f->flag & ARCHIVE_MATCH_OLDER)
					return (1);
			} else if (f->ctime_nsec < nsec) {
				if (f->flag & ARCHIVE_MATCH_NEWER)
					return (1);
			} else if (f->flag & ARCHIVE_MATCH_EQUAL)
				return (1);
		}
	}
	if (f->flag & ARCHIVE_MATCH_MTIME) {
		sec = archive_entry_mtime(entry);
		if (f->mtime_sec > sec) {
			if (f->flag & ARCHIVE_MATCH_OLDER)
				return (1);
		} else if (f->mtime_sec < sec) {
			if (f->flag & ARCHIVE_MATCH_NEWER)
				return (1);
		} else {
			nsec = archive_entry_mtime_nsec(entry);
			if (f->mtime_nsec > nsec) {
				if (f->flag & ARCHIVE_MATCH_OLDER)
					return (1);
			} else if (f->mtime_nsec < nsec) {
				if (f->flag & ARCHIVE_MATCH_NEWER)
					return (1);
			} else if (f->flag & ARCHIVE_MATCH_EQUAL)
				return (1);
		}
	}
	return (0);
}